

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ReduceL1LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducel1(NeuralNetworkLayer *this)

{
  ulong uVar1;
  ReduceL1LayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x4e2) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4e2;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ReduceL1LayerParams>
                       (arena);
    (this->layer_).reducel1_ = pRVar2;
  }
  return (ReduceL1LayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL1LayerParams* NeuralNetworkLayer::_internal_mutable_reducel1() {
  if (!_internal_has_reducel1()) {
    clear_layer();
    set_has_reducel1();
    layer_.reducel1_ = CreateMaybeMessage< ::CoreML::Specification::ReduceL1LayerParams >(GetArenaForAllocation());
  }
  return layer_.reducel1_;
}